

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O3

void __thiscall QSynth::startRecordingAudio(QSynth *this,QString *fileName)

{
  QMutex *pQVar1;
  AudioFileWriter *this_00;
  int __oflag;
  bool bVar2;
  double dVar3;
  
  pQVar1 = this->synthMutex;
  if (pQVar1 != (QMutex *)0x0) {
    LOCK();
    bVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar2) {
      QBasicMutex::lockInternal();
    }
  }
  if (this->audioRecorder != (AudioFileWriter *)0x0) {
    (*this->audioRecorder->_vptr_AudioFileWriter[1])();
  }
  this_00 = (AudioFileWriter *)operator_new(0x48);
  dVar3 = MT32Emu::SampleRateConverter::convertSynthToOutputTimestamp
                    (this->sampleRateConverter,32000.0);
  AudioFileWriter::AudioFileWriter(this_00,(uint)(long)dVar3,fileName);
  this->audioRecorder = this_00;
  AudioFileWriter::open(this_00,(char *)0x1,__oflag);
  if (pQVar1 != (QMutex *)0x0) {
    LOCK();
    bVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x1;
    if (bVar2) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    }
    UNLOCK();
    if (!bVar2) {
      QBasicMutex::unlockInternal();
      return;
    }
  }
  return;
}

Assistant:

void QSynth::startRecordingAudio(const QString &fileName) {
	QMutexLocker synthLocker(synthMutex);
	if (isRecordingAudio()) delete audioRecorder;
	audioRecorder = new AudioFileWriter(sampleRateConverter->convertSynthToOutputTimestamp(SAMPLE_RATE), fileName);
	audioRecorder->open();
}